

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multihash.cpp
# Opt level: O0

int binary::putUvarint(Bytes *buf,UInt val)

{
  byte *pbVar1;
  undefined4 local_18;
  UInt UStack_14;
  uchar x;
  int i;
  UInt val_local;
  Bytes *buf_local;
  
  local_18 = 0;
  for (UStack_14 = val; 0x7f < UStack_14; UStack_14 = UStack_14 >> 7) {
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(buf,(long)local_18);
    *pbVar1 = (byte)UStack_14 | 0x80;
    local_18 = local_18 + 1;
  }
  pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(buf,(long)local_18);
  *pbVar1 = (byte)UStack_14;
  return local_18 + 1;
}

Assistant:

int putUvarint(Bytes &buf, UInt val) {
	int i{};
	unsigned char x{};

	while (val >= 0x80) {
		x = (unsigned char)(val);
		buf.at(i) = x | 0x80;
		val >>= 7;
		i++;
	}
	x = (unsigned char)(val);
	buf.at(i) = x;
	return i + 1;
}